

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O1

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,Point2 *pred,
          Point2 *corr)

{
  int *t;
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Point2 PVar8;
  int *in_RCX;
  int iVar9;
  int iVar10;
  int iVar11;
  int32_t iVar12;
  uint uVar13;
  int iVar14;
  
  iVar4 = pred[2].v_._M_elems[0];
  uVar2 = *(undefined8 *)(corr->v_)._M_elems;
  iVar14 = (int)uVar2 - iVar4;
  *(ulong *)(corr->v_)._M_elems = CONCAT44((int)((ulong)uVar2 >> 0x20) - iVar4,iVar14);
  iVar9 = (corr->v_)._M_elems[1];
  iVar10 = -iVar14;
  if (0 < iVar14) {
    iVar10 = iVar14;
  }
  iVar14 = -iVar9;
  if (0 < iVar9) {
    iVar14 = iVar9;
  }
  t = (corr->v_)._M_elems + 1;
  uVar5 = pred[2].v_._M_elems[0];
  if (uVar5 < (uint)(iVar14 + iVar10)) {
    OctahedronToolBox::InvertDiamond((OctahedronToolBox *)pred,(int32_t *)corr,t);
  }
  iVar9 = (corr->v_)._M_elems[0];
  iVar6 = (corr->v_)._M_elems[1];
  iVar7 = (corr->v_)._M_elems[1];
  iVar11 = (corr->v_)._M_elems[0];
  if (iVar11 == 0) {
    if (iVar7 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (uint)(0 < iVar7) * 2 + 1;
    }
  }
  else if (iVar11 < 1) {
    uVar13 = (uint)(0 < iVar7) * 3;
  }
  else {
    uVar13 = (iVar7 >> 0x1f) + 2;
  }
  if ((iVar9 != 0 || iVar6 != 0) && (0 < iVar6 || -1 < iVar9)) {
    PVar8.v_._M_elems =
         (array<int,_2UL>)
         (*(code *)((long)&DAT_001aadd8 + (long)(int)(&DAT_001aadd8)[uVar13]))
                   ((code *)((long)&DAT_001aadd8 + (long)(int)(&DAT_001aadd8)[uVar13]),
                    (corr->v_)._M_elems[1]);
    return (Point2)PVar8.v_._M_elems;
  }
  iVar12 = *in_RCX + (corr->v_)._M_elems[0];
  iVar7 = pred[2].v_._M_elems[0];
  if (iVar7 < iVar12) {
    iVar12 = iVar12 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar12,-iVar7) != iVar12 + iVar7 < 0) {
    iVar12 = iVar12 + (pred->v_)._M_elems[1];
  }
  iVar11 = in_RCX[1] + *t;
  if (iVar7 < iVar11) {
    iVar11 = iVar11 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar11,-iVar7) != iVar11 + iVar7 < 0) {
    iVar11 = iVar11 + (pred->v_)._M_elems[1];
  }
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_ =
       iVar12;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_quantized_value_
       = iVar11;
  if ((iVar9 != 0 || iVar6 != 0) && (0 < iVar6 || -1 < iVar9)) {
    iVar9 = (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
            super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
            quantization_bits_;
    iVar6 = (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
            super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
            max_quantized_value_;
    switch(-uVar13 & 3) {
    case 1:
      iVar9 = -iVar9;
      iVar7 = iVar6;
      break;
    case 2:
      iVar9 = -iVar9;
      iVar6 = -iVar6;
    case 0:
      iVar7 = iVar9;
      iVar9 = iVar6;
      break;
    case 3:
      iVar7 = -iVar6;
    }
    (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
    super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_
         = iVar7;
    (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
    super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
    max_quantized_value_ = iVar9;
  }
  if (uVar5 < (uint)(iVar14 + iVar10)) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)this,
               &(this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
                super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
                max_quantized_value_);
  }
  uVar1 = (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
          super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
          quantization_bits_;
  uVar3 = (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
          super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
          max_quantized_value_;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_ =
       iVar4 + uVar1;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_quantized_value_
       = iVar4 + uVar3;
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, Point2 corr) const {
    const Point2 t(this->center_value(), this->center_value());
    pred = pred - t;
    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }
    const bool pred_is_in_bottom_left = this->IsInBottomLeft(pred);
    const int32_t rotation_count = this->GetRotationCount(pred);
    if (!pred_is_in_bottom_left) {
      pred = this->RotatePoint(pred, rotation_count);
    }
    Point2 orig(this->ModMax(AddAsUnsigned(pred[0], corr[0])),
                this->ModMax(AddAsUnsigned(pred[1], corr[1])));
    if (!pred_is_in_bottom_left) {
      const int32_t reverse_rotation_count = (4 - rotation_count) % 4;
      orig = this->RotatePoint(orig, reverse_rotation_count);
    }
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }
    orig = orig + t;
    return orig;
  }